

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceULT.cpp
# Opt level: O2

void __thiscall
CTestResource_Test2DTileYResourceArrays_Test::TestBody
          (CTestResource_Test2DTileYResourceArrays_Test *this)

{
  GMM_RESOURCE_FORMAT GVar1;
  uint32_t uVar2;
  int iVar3;
  GMM_RESOURCE_INFO *ResourceInfo;
  uint uVar4;
  uint ExpectedValue;
  uint uVar5;
  undefined8 uStack_b8;
  GMM_RESCREATE_PARAMS gmmParams;
  
  gmmParams.pExistingSysMem = 0;
  gmmParams.Flags.Info = (anon_struct_8_44_94931171_for_Info)0x0;
  gmmParams.MaxLod = 0;
  gmmParams.ArraySize = 0;
  gmmParams.MaximumRenamingListLength = 0;
  gmmParams.NoGfxMemory = '\0';
  gmmParams._109_3_ = 0;
  gmmParams.pPreallocatedResInfo = (GMM_RESOURCE_INFO *)0x0;
  gmmParams.BaseAlignment = 0;
  gmmParams.OverridePitch = 0;
  gmmParams.RotateInfo = 0;
  gmmParams._84_4_ = 0;
  gmmParams.CpTag = 0;
  gmmParams._44_4_ = 0;
  gmmParams.field_6.BaseWidth64 = 0;
  gmmParams.Flags.Wa = (anon_struct_4_14_9f1eeba6_for_Wa)0x0;
  gmmParams.MSAA.SamplePattern = GMM_MSAA_DISABLED;
  gmmParams.MSAA.NumSamples = 0;
  gmmParams.Usage = GMM_RESOURCE_USAGE_UNKNOWN;
  uStack_b8 = 2;
  gmmParams.ExistingSysMemSize = 0x100000000;
  gmmParams.Flags.Gpu = (anon_struct_8_45_9b07292e_for_Gpu)0x1000000000;
  gmmParams.Type = RESOURCE_INVALID;
  gmmParams.Format = GMM_FORMAT_A4P4_UNORM_PALETTE1;
  gmmParams.BaseHeight = 0;
  gmmParams.Depth = 4;
  for (gmmParams.MultiTileArch.Reserved = TEST_BPP_8;
      gmmParams.MultiTileArch.Reserved != TEST_BPP_MAX;
      gmmParams.MultiTileArch.Reserved = gmmParams.MultiTileArch.Reserved + TEST_BPP_16) {
    GVar1 = CTestResource::SetResourceFormat
                      (&this->super_CTestResource,gmmParams.MultiTileArch.Reserved);
    uStack_b8 = CONCAT44(GVar1,(undefined4)uStack_b8);
    uVar2 = CTestResource::GetBppValue(&this->super_CTestResource,gmmParams.MultiTileArch.Reserved);
    gmmParams._40_8_ = ZEXT48((int)(0x80 / (ulong)uVar2) + 1);
    gmmParams.field_6.BaseWidth = 0x21;
    iVar3 = gmmParams.Depth * 0x24;
    uVar5 = gmmParams.Depth * -0x24;
    ResourceInfo = (GMM_RESOURCE_INFO *)
                   (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                             (CommonULT::pGmmULTClientContext,&uStack_b8,0x80 % (ulong)uVar2);
    uVar4 = gmmParams.CpTag + 0xf;
    uVar2 = CTestResource::GetBppValue(&this->super_CTestResource,gmmParams.MultiTileArch.Reserved);
    uVar4 = (uVar4 & 0xfffffff0) * uVar2 + 0x7f;
    ExpectedValue = uVar4 & 0xffffff80;
    CTestResource::VerifyResourceHAlign<true>(&this->super_CTestResource,ResourceInfo,0x10);
    CTestResource::VerifyResourceVAlign<true>(&this->super_CTestResource,ResourceInfo,4);
    CTestResource::VerifyResourcePitch<true>(&this->super_CTestResource,ResourceInfo,ExpectedValue);
    CTestResource::VerifyResourcePitchInTiles<true>
              (&this->super_CTestResource,ResourceInfo,uVar4 >> 7);
    CTestResource::VerifyResourceSize<true>
              (&this->super_CTestResource,ResourceInfo,
               (ulong)(ExpectedValue * ((uVar5 & 0x1c) + iVar3)));
    CTestResource::VerifyResourceQPitch<true>(&this->super_CTestResource,ResourceInfo,0x24);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,ResourceInfo);
  }
  return;
}

Assistant:

TEST_F(CTestResource, Test2DTileYResourceArrays)
{
    // Horizontal/Vertical pixel alignment
    const uint32_t HAlign = 16;
    const uint32_t VAlign = 4;

    const uint32_t TileWidth  = 128;
    const uint32_t TileHeight = 32;

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_2D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.TiledY    = 1;
    gmmParams.Flags.Gpu.Texture    = 1;
    gmmParams.ArraySize            = 4;

    // Allocate 2 tiles in X/Y dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileWidth / GetBppValue(bpp)) + 1; // 1 pixel larger than 1 tile width
        gmmParams.BaseHeight  = TileHeight + 1;                     // 1 row larger than 1 tile height
        uint32_t AlignedHeight, BlockHeight;

        BlockHeight   = GMM_ULT_ALIGN(gmmParams.BaseHeight, VAlign);
        AlignedHeight = GMM_ULT_ALIGN_NP2(BlockHeight * gmmParams.ArraySize, TileHeight);

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        const uint32_t AlignedWidth = GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign);
        uint32_t       PitchInBytes = AlignedWidth * GetBppValue(bpp);
        PitchInBytes                = GMM_ULT_ALIGN(PitchInBytes, TileWidth);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);
        VerifyResourcePitch<true>(ResourceInfo, PitchInBytes);
        VerifyResourcePitchInTiles<true>(ResourceInfo, PitchInBytes / TileWidth);
        VerifyResourceSize<true>(ResourceInfo, PitchInBytes * AlignedHeight); // 4 tile big x 4 array size
        VerifyResourceQPitch<true>(ResourceInfo, BlockHeight);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}